

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* anon_unknown.dwarf_1aacf::nameSplit
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *name)

{
  _List_node_base *p_Var1;
  is_any_ofF<char> iStack_28;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  boost::algorithm::is_any_of<char[2]>(&iStack_28,(char (*) [2])"/");
  boost::algorithm::
  split<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (__return_storage_ptr__,name,&iStack_28,token_compress_on);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&iStack_28);
  while ((p_Var1 = (__return_storage_ptr__->
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next,
         p_Var1 != (_List_node_base *)__return_storage_ptr__ &&
         (p_Var1[1]._M_prev == (_List_node_base *)0x0))) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(__return_storage_ptr__);
  }
  while ((p_Var1 != (_List_node_base *)__return_storage_ptr__ &&
         ((__return_storage_ptr__->
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev == (_List_node_base *)0x0))) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(__return_storage_ptr__);
    p_Var1 = (__return_storage_ptr__->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  return __return_storage_ptr__;
}

Assistant:

static list<string> nameSplit(std::string const& name)
    {
        list<string> separators;
        split(separators, name, is_any_of("/"), boost::token_compress_on);
        while(!separators.empty() && separators.front().empty())
            separators.pop_front();
        while(!separators.empty() && separators.back().empty())
            separators.pop_back();
        return separators;
    }